

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_peek.c
# Opt level: O1

ssize_t mpt_queue_peek(mpt_decode_queue *qu,size_t max,void *dst)

{
  anon_struct_24_3_fb801e77_for_data *paVar1;
  size_t *psVar2;
  ulong uVar3;
  void *pvVar4;
  int iVar5;
  ulong __n;
  uint uVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  iovec src;
  mpt_message local_58;
  iovec local_38;
  
  uVar3 = (qu->data).len;
  __n = 0xfffffffffffffff0;
  if (uVar3 != 0) {
    pvVar4 = (qu->data).base;
    sVar7 = (qu->data).off;
    local_58.base = (void *)((long)pvVar4 + sVar7);
    uVar8 = (qu->data).max - sVar7;
    sVar7 = uVar3 - uVar8;
    if (uVar3 < uVar8 || sVar7 == 0) {
      local_58.cont = (iovec *)0x0;
      local_58.used = uVar3;
    }
    else {
      local_58.cont = &local_38;
      local_58.used = uVar8;
      local_38.iov_base = pvVar4;
      local_38.iov_len = sVar7;
    }
    local_58.clen = (size_t)(uVar3 >= uVar8 && sVar7 != 0);
    uVar8 = (qu->_state).data.pos;
    if (qu->_dec == (mpt_data_decoder_t)0x0) {
      uVar6 = (uint)(qu->_state).data.msg;
      uVar9 = 0;
      if (-1 < (int)uVar6) {
        uVar9 = (ulong)(uVar6 & 0x7fffffff);
      }
      uVar9 = uVar9 + uVar8;
      if (dst == (void *)0x0) {
        iVar5 = (int)uVar3 - (int)uVar9;
        if (-1 < iVar5) {
          __n = (long)iVar5;
        }
      }
      else {
        if ((uVar9 != 0) && (sVar7 = mpt_message_read(&local_58,uVar9,(void *)0x0), sVar7 < uVar9))
        {
          return -0x10;
        }
        __n = mpt_message_read(&local_58,max,dst);
      }
    }
    else {
      uVar3 = (qu->_state).curr;
      if (uVar3 < uVar8) {
        uVar8 = uVar3;
      }
      if ((uVar8 != 0) && (sVar7 = mpt_message_read(&local_58,uVar8,(void *)0x0), sVar7 < uVar8)) {
        return -0x10;
      }
      local_38.iov_base = local_58.base;
      local_38.iov_len = local_58.used;
      paVar1 = &(qu->_state).data;
      paVar1->pos = paVar1->pos - uVar8;
      psVar2 = &(qu->_state).curr;
      *psVar2 = *psVar2 - uVar8;
      iVar5 = (*qu->_dec)(&qu->_state,&local_38,0);
      sVar7 = (qu->_state).data.pos;
      local_58.base = (void *)((long)local_58.base + sVar7);
      (qu->_state).data.pos = sVar7 + uVar8;
      psVar2 = &(qu->_state).curr;
      *psVar2 = *psVar2 + uVar8;
      __n = (qu->_state).data.len;
      if ((dst != (void *)0x0) && (-1 < iVar5)) {
        if (max <= __n) {
          __n = max;
        }
        memcpy(dst,local_58.base,__n);
      }
    }
  }
  return __n;
}

Assistant:

extern ssize_t mpt_queue_peek(MPT_STRUCT(decode_queue) *qu, size_t max, void *dst)
{
	MPT_STRUCT(message) msg;
	struct iovec src;
	size_t off, len;
	int ret;
	
	if (!(len = qu->data.len)) {
		return MPT_ERROR(MissingData);
	}
	off = qu->data.off;
	msg.base = ((uint8_t *) qu->data.base) + off;
	
	/* message setup */
	if (len > (qu->data.max - off)) {
		msg.used = qu->data.max - off;
		msg.clen = 1;
		msg.cont = &src;
		src.iov_base = qu->data.base;
		src.iov_len  = len - msg.used;
	} else {
		msg.used = len;
		msg.clen = 0;
		msg.cont = 0;
	}
	off = qu->_state.data.pos;
	
	/* final data available */
	if (!qu->_dec) {
		if ((ret = qu->_state.data.msg) >= 0) {
			off += ret;
		}
		if (!dst) {
			ret = len - off;
			return ret >= 0 ? ret : MPT_ERROR(MissingData);
		}
		if (off && (mpt_message_read(&msg, off, 0) < off)) {
			return MPT_ERROR(MissingData);
		}
		return mpt_message_read(&msg, max, dst);
	}
	/* work area reduces offset */
	len = qu->_state.curr;
	if (len < off) {
		off = len;
	}
	if (off && (mpt_message_read(&msg, off, 0) < off)) {
		return MPT_ERROR(MissingData);
	}
	src.iov_base = (void *) msg.base;
	src.iov_len  = msg.used;
	
	/* reduce wrap size */
	qu->_state.data.pos -= off;
	qu->_state.curr -= off;
	/* peek for new data */
	ret = qu->_dec(&qu->_state, &src, 0);
	len = qu->_state.data.pos;
	msg.base = (uint8_t *) msg.base + len;
	/* restore offsets */
	qu->_state.data.pos = len + off;
	qu->_state.curr += off;
	len = qu->_state.data.len;
	
	if (ret < 0 || !dst) {
		return len;
	}
	/* get data start and length */
	if (len > max) {
		len = max;
	}
	(void) memcpy(dst, msg.base, len);
	
	return len;
}